

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::collect_labels_from_leaf
               (memory_tree *b,uint32_t cn,v_array<unsigned_int> *leaf_labs)

{
  example *peVar1;
  wclass *pwVar2;
  node *pnVar3;
  uint *puVar4;
  float *pfVar5;
  wclass *pwVar6;
  ulong uVar7;
  uint32_t lab;
  float local_34;
  
  if ((b->nodes)._begin[cn].internal != -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"something is wrong, it should be a leaf node",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  v_array<unsigned_int>::clear(leaf_labs);
  pnVar3 = (b->nodes)._begin;
  puVar4 = pnVar3[cn].examples_index._begin;
  if (pnVar3[cn].examples_index._end != puVar4) {
    uVar7 = 0;
    do {
      peVar1 = (b->examples)._begin[puVar4[uVar7]];
      pwVar6 = (wclass *)(peVar1->l).multilabels.label_v._begin;
      pwVar2 = (peVar1->l).cs.costs._end;
      if (pwVar6 != pwVar2) {
        do {
          local_34 = pwVar6->x;
          for (pfVar5 = (float *)leaf_labs->_begin; pfVar5 != (float *)leaf_labs->_end;
              pfVar5 = pfVar5 + 1) {
            if (*pfVar5 == local_34) goto LAB_001fc4da;
          }
          v_array<unsigned_int>::push_back(leaf_labs,(uint *)&local_34);
LAB_001fc4da:
          pwVar6 = (wclass *)&pwVar6->class_index;
        } while (pwVar6 != pwVar2);
        pnVar3 = (b->nodes)._begin;
      }
      uVar7 = uVar7 + 1;
      puVar4 = pnVar3[cn].examples_index._begin;
    } while (uVar7 < (ulong)((long)pnVar3[cn].examples_index._end - (long)puVar4 >> 2));
  }
  return;
}

Assistant:

void collect_labels_from_leaf(memory_tree& b, const uint32_t cn, v_array<uint32_t>& leaf_labs){
        if (b.nodes[cn].internal != -1)
            cout<<"something is wrong, it should be a leaf node"<<endl;
    
        leaf_labs.clear();
        for (size_t i = 0; i < b.nodes[cn].examples_index.size(); i++){ //scan through each memory in the leaf
            uint32_t loc = b.nodes[cn].examples_index[i];
            for (uint32_t lab: b.examples[loc]->l.multilabels.label_v){ //scan through each label:
                if (v_array_contains(leaf_labs, lab) == false)
                    leaf_labs.push_back(lab); 
            }
        }
    }